

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::outputPostRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong *puVar8;
  size_type *psVar9;
  undefined8 *puVar10;
  ulong uVar11;
  char cVar12;
  char cVar13;
  undefined8 uVar14;
  ulong uVar15;
  bool bVar16;
  string k;
  string __str_5;
  string __str;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string *local_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  bitset<7UL> *local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  long local_40;
  size_t local_38;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  local_98 = __return_storage_ptr__;
  local_70 = increasing;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar7 = numOfAggs + 1;
  local_48 = paVar1;
  local_38 = numOfAggs;
  if (uVar7 < 3) {
    if (uVar7 == 0) {
      return local_98;
    }
    local_40 = stringOffset * 3;
    paVar1 = &local_b8.field_2;
    paVar2 = &local_d8.field_2;
    uVar7 = 0;
    do {
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct((ulong)local_68,(char)local_40);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_b8.field_2._M_allocated_capacity = *puVar8;
        local_b8.field_2._8_8_ = plVar5[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *puVar8;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      uVar15 = idx->indexes[2] + uVar7;
      cVar12 = '\x01';
      if (9 < uVar15) {
        uVar11 = uVar15;
        cVar13 = '\x04';
        do {
          cVar12 = cVar13;
          if (uVar11 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_0024d840;
          }
          if (uVar11 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_0024d840;
          }
          if (uVar11 < 10000) goto LAB_0024d840;
          bVar16 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar13 = cVar12 + '\x04';
        } while (bVar16);
        cVar12 = cVar12 + '\x01';
      }
LAB_0024d840:
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar15);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        uVar14 = local_b8.field_2._M_allocated_capacity;
      }
      uVar15 = CONCAT44(uStack_84,local_88) + local_b8._M_string_length;
      if ((ulong)uVar14 < uVar15) {
        uVar11 = 0xf;
        if (local_90 != local_80) {
          uVar11 = local_80[0];
        }
        if (uVar11 < uVar15) goto LAB_0024d8c2;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      }
      else {
LAB_0024d8c2:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
      }
      local_f8 = &local_e8;
      puVar10 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar10) {
        local_e8 = *puVar10;
        uStack_e0 = puVar6[3];
      }
      else {
        local_e8 = *puVar10;
        local_f8 = (undefined8 *)*puVar6;
      }
      local_f0 = puVar6[1];
      *puVar6 = puVar10;
      puVar6[1] = 0;
      *(undefined1 *)puVar10 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_d8.field_2._M_allocated_capacity = *psVar9;
        local_d8.field_2._8_8_ = plVar5[3];
        local_d8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar9;
        local_d8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (local_68[0] != local_58) {
        operator_delete(local_68[0]);
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"WE EXPECT LOCAL IN POST REG TO BE SET!! \n",0x29);
      }
      else {
        uVar15 = (-(ulong)((uint)(local_70->super__Base_bitset<1UL>)._M_w & 1) & uVar7) +
                 idx->indexes[0];
        cVar12 = '\x01';
        if (9 < uVar15) {
          uVar11 = uVar15;
          cVar13 = '\x04';
          do {
            cVar12 = cVar13;
            if (uVar11 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0024da7e;
            }
            if (uVar11 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0024da7e;
            }
            if (uVar11 < 10000) goto LAB_0024da7e;
            bVar16 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar13 = cVar12 + '\x04';
          } while (bVar16);
          cVar12 = cVar12 + '\x01';
        }
LAB_0024da7e:
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_b8._M_dataplus._M_p,(uint)local_b8._M_string_length,uVar15);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2b0ad7);
        local_f8 = &local_e8;
        puVar10 = puVar6 + 2;
        if ((undefined8 *)*puVar6 == puVar10) {
          local_e8 = *puVar10;
          uStack_e0 = puVar6[3];
        }
        else {
          local_e8 = *puVar10;
          local_f8 = (undefined8 *)*puVar6;
        }
        local_f0 = puVar6[1];
        *puVar6 = puVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        psVar9 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8.field_2._8_8_ = puVar6[3];
          local_d8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_d8._M_string_length = puVar6[1];
        *puVar6 = psVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
        uVar15 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & uVar7) +
                 idx->indexes[1];
        cVar12 = '\x01';
        if (9 < uVar15) {
          uVar11 = uVar15;
          cVar13 = '\x04';
          do {
            cVar12 = cVar13;
            if (uVar11 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0024dc1c;
            }
            if (uVar11 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0024dc1c;
            }
            if (uVar11 < 10000) goto LAB_0024dc1c;
            bVar16 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar13 = cVar12 + '\x04';
          } while (bVar16);
          cVar12 = cVar12 + '\x01';
        }
LAB_0024dc1c:
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_b8._M_dataplus._M_p,(uint)local_b8._M_string_length,uVar15);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2b0b1c);
        puVar10 = puVar6 + 2;
        if ((undefined8 *)*puVar6 == puVar10) {
          local_e8 = *puVar10;
          uStack_e0 = puVar6[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *puVar10;
          local_f8 = (undefined8 *)*puVar6;
        }
        local_f0 = puVar6[1];
        *puVar6 = puVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        psVar9 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8.field_2._8_8_ = puVar6[3];
          local_d8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_d8._M_string_length = puVar6[1];
        *puVar6 = psVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      }
      psVar3 = local_98;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)psVar3);
      bVar16 = uVar7 == local_38;
      uVar7 = uVar7 + 1;
      if (bVar16) {
        return local_98;
      }
    } while( true );
  }
  cVar12 = (char)stringOffset * '\x03';
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,cVar12);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
  paVar1 = &local_b8.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_b8.field_2._M_allocated_capacity = *puVar8;
    local_b8.field_2._8_8_ = plVar5[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar8;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < uVar7) {
    uVar15 = uVar7;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (uVar15 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0024dded;
      }
      if (uVar15 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0024dded;
      }
      if (uVar15 < 10000) goto LAB_0024dded;
      bVar16 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar16);
    cVar13 = cVar13 + '\x01';
  }
LAB_0024dded:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar7);
  uVar7 = CONCAT44(uStack_84,local_88) + local_b8._M_string_length;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    uVar14 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar7) {
    uVar15 = 0xf;
    if (local_90 != local_80) {
      uVar15 = local_80[0];
    }
    if (uVar15 < uVar7) goto LAB_0024de61;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
  }
  else {
LAB_0024de61:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
  }
  local_f8 = &local_e8;
  puVar10 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar10) {
    local_e8 = *puVar10;
    uStack_e0 = puVar6[3];
  }
  else {
    local_e8 = *puVar10;
    local_f8 = (undefined8 *)*puVar6;
  }
  local_f0 = puVar6[1];
  *puVar6 = puVar10;
  puVar6[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  paVar2 = &local_d8.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,cVar12 + '\x03');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_b8.field_2._M_allocated_capacity = *puVar8;
    local_b8.field_2._8_8_ = plVar5[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar8;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar7 = idx->indexes[2];
  cVar12 = '\x01';
  if (9 < uVar7) {
    uVar15 = uVar7;
    cVar13 = '\x04';
    do {
      cVar12 = cVar13;
      if (uVar15 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0024e056;
      }
      if (uVar15 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0024e056;
      }
      if (uVar15 < 10000) goto LAB_0024e056;
      bVar16 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar13 = cVar12 + '\x04';
    } while (bVar16);
    cVar12 = cVar12 + '\x01';
  }
LAB_0024e056:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,uVar7);
  uVar7 = CONCAT44(uStack_84,local_88) + local_b8._M_string_length;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    uVar14 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar7) {
    uVar15 = 0xf;
    if (local_90 != local_80) {
      uVar15 = local_80[0];
    }
    if (uVar7 <= uVar15) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      goto LAB_0024e0db;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
LAB_0024e0db:
  local_f8 = &local_e8;
  puVar10 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar10) {
    local_e8 = *puVar10;
    uStack_e0 = puVar6[3];
  }
  else {
    local_e8 = *puVar10;
    local_f8 = (undefined8 *)*puVar6;
  }
  local_f0 = puVar6[1];
  *puVar6 = puVar10;
  puVar6[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8.field_2._8_8_ = plVar5[3];
    local_d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar9;
    local_d8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_d8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  uVar7 = (idx->present).super__Base_bitset<1UL>._M_w;
  if ((uVar7 & 1) != 0) {
    uVar7 = idx->indexes[0];
    cVar12 = '\x01';
    if (9 < uVar7) {
      uVar15 = uVar7;
      cVar13 = '\x04';
      do {
        cVar12 = cVar13;
        if (uVar15 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_0024e24b;
        }
        if (uVar15 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_0024e24b;
        }
        if (uVar15 < 10000) goto LAB_0024e24b;
        bVar16 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar13 = cVar12 + '\x04';
      } while (bVar16);
      cVar12 = cVar12 + '\x01';
    }
LAB_0024e24b:
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d8._M_dataplus._M_p,(uint)local_d8._M_string_length,uVar7);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 1) != 0) {
      std::__cxx11::string::append((char *)&local_d8);
    }
    std::operator+(&local_b8,"aggregateRegister[",&local_d8);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    puVar10 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar10) {
      local_e8 = *puVar10;
      uStack_e0 = puVar6[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar10;
      local_f8 = (undefined8 *)*puVar6;
    }
    local_f0 = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_98,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    uVar7 = (idx->present).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar7 & 2) != 0) {
    uVar7 = idx->indexes[1];
    cVar12 = '\x01';
    if (9 < uVar7) {
      uVar15 = uVar7;
      cVar13 = '\x04';
      do {
        cVar12 = cVar13;
        if (uVar15 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_0024e3a7;
        }
        if (uVar15 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_0024e3a7;
        }
        if (uVar15 < 10000) goto LAB_0024e3a7;
        bVar16 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar13 = cVar12 + '\x04';
      } while (bVar16);
      cVar12 = cVar12 + '\x01';
    }
LAB_0024e3a7:
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d8._M_dataplus._M_p,(uint)local_d8._M_string_length,uVar7);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 2) != 0) {
      std::__cxx11::string::append((char *)&local_d8);
    }
    std::operator+(&local_b8,"postRegister[",&local_d8);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    puVar10 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar10) {
      local_e8 = *puVar10;
      uStack_e0 = puVar6[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar10;
      local_f8 = (undefined8 *)*puVar6;
    }
    local_f0 = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_98,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  psVar3 = local_98;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)psVar3);
  return local_98;
}

Assistant:

std::string CppGenerator::outputPostRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset)
{
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";
        outString += offset(stringOffset+1)+
            "postRegister["+std::to_string(idx.indexes[2])+"+i] += ";
        
        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }
        // else
        // {
        //     ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
        //     //  exit(1);
        // }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="postRegister["+k+"]*";
        }
        
        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            outString += offset(stringOffset)+
                "postRegister["+std::to_string(idx.indexes[2]+i)+"] += ";
            
            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }
            else
            {
                ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
                // exit(1);
            }
            
            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="postRegister["+std::to_string(k)+"]*";
            }
            
            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}